

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O2

void __thiscall
cfdcapi_key_SchnorrTest_Test::cfdcapi_key_SchnorrTest_Test(cfdcapi_key_SchnorrTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006518f8;
  return;
}

Assistant:

TEST(cfdcapi_key, SchnorrTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* msg =
      "e48441762fb75010b2aa31a512b62b4148aa3fb08eb0765d76b252559064a614";
  static const char* sk =
      "688c77bc2d5aaff5491cf309d4753b732135470d05b7b2cd21add0744fe97bef";
  static const char* pubkey =
      "b33cc9edc096d0a83416964bd3c6247b8fecd256e4efa7870d2c854bdeb33390";
  static const char* aux_rand =
      "02cce08e913f22a36c5648d6405a2c7c50106e7aa2f1649e381c7f09d16b80ab";
  static const char* nonce =
      "8c8ca771d3c25eb38de7401818eeda281ac5446f5c1396148f8d9d67592440fe";
  static const char* schnorr_nonce =
      "f14d7e54ff58c5d019ce9986be4a0e8b7d643bd08ef2cdf1099e1a457865b547";
  static const char* signature =
      "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee"
      "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8";

  char* schnorr_signature;
  ret = CfdSignSchnorr(handle, msg, sk, aux_rand, &schnorr_signature);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(signature, schnorr_signature);
    CfdFreeStringBuffer(schnorr_signature);
    schnorr_signature = NULL;
  }

  static const char* expected_sig =
      "5da618c1936ec728e5ccff29207f1680dcf4146370bdcfab0039951b91e3637a958e91"
      "d68537d1f6f19687cec1fd5db1d83da56ef3ade1f3c611babd7d08af42";
  ret = CfdSignSchnorrWithNonce(handle, msg, sk, nonce, &schnorr_signature);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(expected_sig, schnorr_signature);
    CfdFreeStringBuffer(schnorr_signature);
    schnorr_signature = NULL;
  }

  static const char* expected_sig_point =
      "03735acf82eef9da1540efb07a68251d5476dabb11ac77054924eccbb4121885e8";
  char* sigpoint = NULL;
  ret = CfdComputeSchnorrSigPoint(handle, msg, schnorr_nonce, pubkey, &sigpoint);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(expected_sig_point, sigpoint);
    CfdFreeStringBuffer(sigpoint);
  }

  ret = CfdVerifySchnorr(handle, signature, msg, pubkey);
  EXPECT_EQ(kCfdSuccess, ret);

  const char* expected_nonce =
      "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee";
  const char* expected_privkey =
      "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8";
  char* sigs_nonce = NULL;
  char* sigs_key = NULL;
  ret = CfdSplitSchnorrSignature(handle, signature, &sigs_nonce, &sigs_key);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(expected_nonce, sigs_nonce);
    EXPECT_STREQ(expected_privkey, sigs_key);
    CfdFreeStringBuffer(sigs_nonce);
    CfdFreeStringBuffer(sigs_key);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}